

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-output.c
# Opt level: O2

_Bool region_inside(region_conflict *loc,ui_event *key)

{
  if ((loc->col <= (int)(uint)(key->mouse).x) && ((int)(uint)(key->mouse).x < loc->col + loc->width)
     ) {
    if (loc->row <= (int)(uint)(key->mouse).y) {
      return (int)(uint)(key->mouse).y < loc->row + loc->page_rows;
    }
  }
  return false;
}

Assistant:

bool region_inside(const region *loc, const ui_event *key)
{
	if ((loc->col > key->mouse.x) || (loc->col + loc->width <= key->mouse.x))
		return false;

	if ((loc->row > key->mouse.y) ||
		(loc->row + loc->page_rows <= key->mouse.y))
		return false;

	return true;
}